

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2-sse2.c
# Opt level: O1

void fill_segment_sse2(argon2_instance_t *instance,argon2_position_t position)

{
  uint8_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint64_t *puVar4;
  ulong uVar5;
  uint uVar6;
  undefined8 unaff_R12;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  block input_block;
  block address_block;
  __m128i state [64];
  argon2_position_t local_c58;
  uint local_c44;
  ulong local_c40;
  block local_c38;
  block local_838;
  longlong local_438 [129];
  
  if (instance != (argon2_instance_t *)0x0) {
    uVar7 = CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
    if (((instance->type != Argon2_i) && (uVar7 = 0, instance->type == Argon2_id)) &&
       (local_c58.pass = position.pass, local_c58.pass == 0)) {
      local_c58.slice = position.slice;
      uVar7 = (ulong)(local_c58.slice < 2);
    }
    local_c58._0_8_ = position._0_8_;
    local_c58._8_8_ = position._8_8_;
    if ((byte)uVar7 != 0) {
      init_block_value(&local_c38,'\0');
      local_c38.v[0] = local_c58._0_8_ & 0xffffffff;
      local_c38.v[1] = (ulong)local_c58._0_8_ >> 0x20;
      local_c38.v[2] = local_c58._8_8_ & 0xff;
      local_c38.v[3] = (uint64_t)instance->memory_blocks;
      local_c38.v[4] = (uint64_t)instance->passes;
      local_c38.v[5] = (uint64_t)instance->type;
    }
    uVar1 = local_c58.slice;
    bVar2 = local_c58.slice == 0 && local_c58.pass == 0;
    if (((byte)uVar7 & bVar2) == 1) {
      next_addresses(&local_838,&local_c38);
      uVar8 = 2;
    }
    else {
      uVar8 = (uint)bVar2 * 2;
    }
    uVar6 = instance->segment_length;
    uVar10 = instance->lane_length;
    uVar9 = uVar1 * uVar6 + local_c58.lane * uVar10;
    local_c40 = (ulong)uVar9;
    uVar9 = uVar9 + uVar8;
    uVar5 = (ulong)((-(uint)(uVar9 % uVar10 != 0) | uVar10 - 1) + uVar9);
    memcpy(local_438,instance->memory + uVar5,0x400);
    local_c44 = (uint)uVar7;
    if (uVar8 < uVar6) {
      do {
        uVar6 = (int)local_c40 + uVar8;
        uVar11 = (ulong)((int)local_c40 + -1 + uVar8);
        if (uVar6 % instance->lane_length != 1) {
          uVar11 = uVar5;
        }
        if ((char)uVar7 == '\0') {
          puVar4 = instance->memory[uVar11].v;
        }
        else {
          if ((uVar8 & 0x7f) == 0) {
            next_addresses(&local_838,&local_c38);
          }
          puVar4 = local_838.v + (uVar8 & 0x7f);
        }
        uVar10 = 0;
        uVar5 = (*puVar4 >> 0x20) % (ulong)instance->lanes;
        uVar7 = uVar5;
        if (local_c58.slice == '\0') {
          uVar7 = (ulong)local_c58._0_8_ >> 0x20;
        }
        if (local_c58.pass != 0) {
          uVar7 = uVar5;
        }
        local_c58.index = uVar8;
        uVar3 = index_alpha(instance,&local_c58,(uint32_t)*puVar4,
                            (uint)(uVar7 == (ulong)local_c58._0_8_ >> 0x20));
        if (local_c58.pass != 0) {
          uVar10 = (uint)(instance->version != 0x10);
        }
        fill_block((__m128i *)local_438,
                   instance->memory + uVar7 * instance->lane_length + (ulong)uVar3,
                   instance->memory + uVar6,uVar10);
        uVar8 = uVar8 + 1;
        uVar5 = (ulong)((int)uVar11 + 1);
        uVar7 = (ulong)local_c44;
      } while (uVar8 < instance->segment_length);
    }
  }
  return;
}

Assistant:

void fill_segment_sse2(const argon2_instance_t *instance,
                       argon2_position_t position)
{
    fill_segment_128(instance, position);
}